

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

void __thiscall llvm::detail::IEEEFloat::IEEEFloat(IEEEFloat *this,IEEEFloat *rhs)

{
  initialize(this,rhs->semantics);
  assign(this,rhs);
  return;
}

Assistant:

IEEEFloat::IEEEFloat(const IEEEFloat &rhs) {
  initialize(rhs.semantics);
  assign(rhs);
}